

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTable::selectColumn(QAccessibleTable *this,int column)

{
  bool bVar1;
  SelectionBehavior SVar2;
  SelectionMode SVar3;
  int iVar4;
  QFlags<QItemSelectionModel::SelectionFlag> QVar5;
  QAbstractItemModel *pQVar6;
  QItemSelectionModel *pQVar7;
  ulong uVar8;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionModel *selectionModel;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex index;
  QModelIndex rootIndex;
  enum_type in_stack_ffffffffffffff70;
  enum_type in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  bool local_39;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  view((QAccessibleTable *)0x7f41b4);
  pQVar6 = QAbstractItemView::model
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  pQVar7 = QAbstractItemView::selectionModel
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if ((pQVar6 == (QAbstractItemModel *)0x0) || (pQVar7 == (QItemSelectionModel *)0x0)) {
    local_39 = false;
    goto LAB_007f437a;
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)pQVar6 + 0x60))(&local_38,pQVar6,0,in_ESI,&local_20);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (bVar1) {
    view((QAccessibleTable *)0x7f4283);
    SVar2 = QAbstractItemView::selectionBehavior
                      ((QAbstractItemView *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (SVar2 != SelectRows) {
      SVar3 = QAbstractItemView::selectionMode
                        ((QAbstractItemView *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if (SVar3 == NoSelection) {
        local_39 = false;
        goto LAB_007f437a;
      }
      if (SVar3 == SingleSelection) {
        SVar2 = QAbstractItemView::selectionBehavior
                          ((QAbstractItemView *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        if ((SVar2 != SelectColumns) && (iVar4 = (**(code **)(*in_RDI + 0x60))(), 1 < iVar4)) {
          local_39 = false;
          goto LAB_007f437a;
        }
LAB_007f42fb:
        if (((in_ESI == 0) ||
            (uVar8 = QItemSelectionModel::isColumnSelected
                               ((int)pQVar7,(QModelIndex *)(ulong)(in_ESI - 1)), (uVar8 & 1) == 0))
           && (uVar8 = QItemSelectionModel::isColumnSelected
                                 ((int)pQVar7,(QModelIndex *)(ulong)(in_ESI + 1)), (uVar8 & 1) == 0)
           ) {
          QAbstractItemView::clearSelection
                    ((QAbstractItemView *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        }
      }
      else if (SVar3 == ContiguousSelection) goto LAB_007f42fb;
      QVar5 = ::operator|(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
      (**(code **)(*(long *)pQVar7 + 0x68))
                (pQVar7,&local_38,
                 QVar5.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      local_39 = true;
      goto LAB_007f437a;
    }
  }
  local_39 = false;
LAB_007f437a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QAccessibleTable::selectColumn(int column)
{
    QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    auto *selectionModel = theView->selectionModel();
    if (!theModel || !selectionModel)
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(0, column, rootIndex);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectRows)
        return false;

    switch (theView->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if (theView->selectionBehavior() != QAbstractItemView::SelectColumns && rowCount() > 1)
            return false;
        Q_FALLTHROUGH();
    case QAbstractItemView::ContiguousSelection:
        if ((!column || !selectionModel->isColumnSelected(column - 1, rootIndex))
            && !selectionModel->isColumnSelected(column + 1, rootIndex)) {
            theView->clearSelection();
        }
        break;
    default:
        break;
    }

    selectionModel->select(index, QItemSelectionModel::Select | QItemSelectionModel::Columns);
    return true;
}